

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true> __thiscall
duckdb::BlockingSample::Deserialize(BlockingSample *this,Deserializer *deserializer)

{
  _func_int **pp_Var1;
  _Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false> __ptr_00;
  undefined1 auVar2 [8];
  undefined8 uVar3;
  SampleType SVar4;
  undefined1 uVar5;
  uint uVar6;
  int iVar7;
  pointer pBVar8;
  SerializationException *this_00;
  pointer *__ptr;
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  base_reservoir_sample;
  string str;
  undefined1 local_50 [8];
  undefined1 local_48 [32];
  
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::BaseReservoirSampling,std::default_delete<duckdb::BaseReservoirSampling>,true>>
            ((Deserializer *)local_50,(field_id_t)deserializer,(char *)0x64);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_48,deserializer);
    SVar4 = EnumUtil::FromString<duckdb::SampleType>((char *)local_48._0_8_);
    uVar6 = (uint)SVar4;
    if ((undefined1 *)local_48._0_8_ != local_48 + 0x10) {
      operator_delete((void *)local_48._0_8_);
    }
  }
  else {
    uVar6 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar7 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x66,"destroyed");
  if ((char)iVar7 == '\0') {
    uVar5 = false;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar7 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar5 = (undefined1)iVar7;
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this->_vptr_BlockingSample = (_func_int **)0x0;
  if ((char)uVar6 == '\x01') {
    ReservoirSample::Deserialize((ReservoirSample *)local_48,deserializer);
  }
  else {
    if ((uVar6 & 0xff) != 2) {
      this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
      local_48._0_8_ = local_48 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"Unsupported type for deserialization of BlockingSample!","");
      SerializationException::SerializationException(this_00,(string *)local_48);
      __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ReservoirSamplePercentage::Deserialize((ReservoirSamplePercentage *)local_48,deserializer);
  }
  uVar3 = local_48._0_8_;
  local_48._0_8_ = (_func_int **)0x0;
  pp_Var1 = this->_vptr_BlockingSample;
  this->_vptr_BlockingSample = (_func_int **)uVar3;
  if (pp_Var1 != (_func_int **)0x0) {
    (**(code **)(*pp_Var1 + 8))();
  }
  pBVar8 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
           operator->((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                       *)this);
  auVar2 = local_50;
  local_50 = (undefined1  [8])0x0;
  __ptr_00._M_head_impl =
       (pBVar8->base_reservoir_sample).
       super_unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BaseReservoirSampling_*,_std::default_delete<duckdb::BaseReservoirSampling>_>
       .super__Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false>._M_head_impl;
  (pBVar8->base_reservoir_sample).
  super_unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BaseReservoirSampling_*,_std::default_delete<duckdb::BaseReservoirSampling>_>
  .super__Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false>._M_head_impl =
       (BaseReservoirSampling *)auVar2;
  if (__ptr_00._M_head_impl != (BaseReservoirSampling *)0x0) {
    ::std::default_delete<duckdb::BaseReservoirSampling>::operator()
              ((default_delete<duckdb::BaseReservoirSampling> *)&pBVar8->base_reservoir_sample,
               __ptr_00._M_head_impl);
  }
  pBVar8 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
           operator->((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                       *)this);
  pBVar8->destroyed = (bool)uVar5;
  if (local_50 != (undefined1  [8])0x0) {
    ::std::default_delete<duckdb::BaseReservoirSampling>::operator()
              ((default_delete<duckdb::BaseReservoirSampling> *)local_50,
               (BaseReservoirSampling *)local_50);
  }
  return (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)
         (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)this;
}

Assistant:

unique_ptr<BlockingSample> BlockingSample::Deserialize(Deserializer &deserializer) {
	auto base_reservoir_sample = deserializer.ReadPropertyWithDefault<unique_ptr<BaseReservoirSampling>>(100, "base_reservoir_sample");
	auto type = deserializer.ReadProperty<SampleType>(101, "type");
	auto destroyed = deserializer.ReadPropertyWithDefault<bool>(102, "destroyed");
	unique_ptr<BlockingSample> result;
	switch (type) {
	case SampleType::RESERVOIR_PERCENTAGE_SAMPLE:
		result = ReservoirSamplePercentage::Deserialize(deserializer);
		break;
	case SampleType::RESERVOIR_SAMPLE:
		result = ReservoirSample::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of BlockingSample!");
	}
	result->base_reservoir_sample = std::move(base_reservoir_sample);
	result->destroyed = destroyed;
	return result;
}